

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBControlTransfers.h
# Opt level: O0

void __thiscall
USBControlTransferParser::SetHIDUsagePage(USBControlTransferParser *this,U16 usagePage)

{
  value_type vVar1;
  bool bVar2;
  reference pvVar3;
  value_type_conflict2 local_14;
  value_type local_12;
  USBControlTransferParser *pUStack_10;
  U16 usagePage_local;
  USBControlTransferParser *this_local;
  
  local_12 = usagePage;
  pUStack_10 = this;
  bVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::empty
                    (&this->mHidUsagePageStack);
  if (bVar2) {
    local_14 = 0;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              (&this->mHidUsagePageStack,&local_14);
  }
  vVar1 = local_12;
  pvVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::back
                     (&this->mHidUsagePageStack);
  *pvVar3 = vVar1;
  return;
}

Assistant:

void SetHIDUsagePage( U16 usagePage )
    {
        if( mHidUsagePageStack.empty() )
            mHidUsagePageStack.push_back( 0 );

        mHidUsagePageStack.back() = usagePage;
    }